

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

AMQP_VALUE amqpvalue_create_error(ERROR_HANDLE error)

{
  AMQP_VALUE pAVar1;
  
  if (error != (ERROR_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(error->composite_value);
    return pAVar1;
  }
  return (AMQP_VALUE)0x0;
}

Assistant:

AMQP_VALUE amqpvalue_create_error(ERROR_HANDLE error)
{
    AMQP_VALUE result;

    if (error == NULL)
    {
        result = NULL;
    }
    else
    {
        ERROR_INSTANCE* error_instance = (ERROR_INSTANCE*)error;
        result = amqpvalue_clone(error_instance->composite_value);
    }

    return result;
}